

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.hpp
# Opt level: O3

void __thiscall
re::fft::fft<float,2048l,(re::fft::direction)1>::butterfly_radix8<2048l>
          (fft<float,_2048L,_(re::fft::direction)1> *this,span<std::complex<float>,_2048L> out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _ComplexT _Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  lVar6 = 6;
  lVar7 = 5;
  lVar8 = 0x38;
  lVar9 = 0;
  do {
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x808 + lVar9);
    uVar2 = *(undefined8 *)((long)&(this->twiddles)._M_elems[4]._M_value + lVar9 * 4);
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    fVar13 = (float)uVar1;
    fVar11 = (float)uVar2;
    fVar12 = (float)((ulong)uVar2 >> 0x20);
    *(ulong *)((long)out.storage_.data_ + 0x808 + lVar9) =
         CONCAT44(fVar13 * fVar12 + fVar11 * fVar10,fVar13 * fVar11 + fVar12 * -fVar10);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x1008 + lVar9);
    uVar2 = *(undefined8 *)((long)&(this->twiddles)._M_elems[2]._M_value + lVar9 * 2);
    fVar11 = (float)((ulong)uVar1 >> 0x20);
    fVar13 = (float)uVar1;
    fVar12 = (float)uVar2;
    fVar27 = (float)((ulong)uVar2 >> 0x20);
    fVar10 = fVar13 * fVar12 + fVar27 * -fVar11;
    fVar11 = fVar13 * fVar27 + fVar12 * fVar11;
    *(ulong *)((long)out.storage_.data_ + 0x1008 + lVar9) = CONCAT44(fVar11,fVar10);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x1808 + lVar9);
    _Var3 = (this->twiddles)._M_elems[lVar6]._M_value;
    fVar15 = (float)((ulong)uVar1 >> 0x20);
    fVar27 = (float)uVar1;
    fVar13 = (float)_Var3;
    fVar12 = (float)(_Var3 >> 0x20);
    fVar14 = fVar27 * fVar13 + fVar12 * -fVar15;
    fVar15 = fVar27 * fVar12 + fVar13 * fVar15;
    *(ulong *)((long)out.storage_.data_ + 0x1808 + lVar9) = CONCAT44(fVar15,fVar14);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x2008 + lVar9);
    uVar2 = *(undefined8 *)((long)&(this->twiddles)._M_elems[1]._M_value + lVar9);
    fVar27 = (float)((ulong)uVar1 >> 0x20);
    fVar13 = (float)uVar1;
    fVar16 = (float)uVar2;
    fVar17 = (float)((ulong)uVar2 >> 0x20);
    fVar12 = fVar13 * fVar16 + fVar17 * -fVar27;
    fVar13 = fVar13 * fVar17 + fVar16 * fVar27;
    *(ulong *)((long)out.storage_.data_ + 0x2008 + lVar9) = CONCAT44(fVar13,fVar12);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x2808 + lVar9);
    _Var3 = (this->twiddles)._M_elems[lVar7]._M_value;
    fVar17 = (float)uVar1;
    fVar18 = (float)((ulong)uVar1 >> 0x20);
    fVar27 = (float)_Var3;
    fVar16 = (float)(_Var3 >> 0x20);
    fVar22 = fVar17 * fVar27 + fVar16 * -fVar18;
    fVar23 = fVar17 * fVar16 + fVar27 * fVar18;
    *(ulong *)((long)out.storage_.data_ + 0x2808 + lVar9) = CONCAT44(fVar23,fVar22);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x3008 + lVar9);
    uVar2 = *(undefined8 *)((long)&(this->twiddles)._M_elems[0]._M_value + lVar6 * 4);
    fVar17 = (float)uVar1;
    fVar18 = (float)((ulong)uVar1 >> 0x20);
    fVar27 = (float)uVar2;
    fVar16 = (float)((ulong)uVar2 >> 0x20);
    fVar20 = fVar17 * fVar27 + fVar16 * -fVar18;
    fVar21 = fVar17 * fVar16 + fVar27 * fVar18;
    *(ulong *)((long)out.storage_.data_ + 0x3008 + lVar9) = CONCAT44(fVar21,fVar20);
    uVar1 = *(undefined8 *)((long)out.storage_.data_ + 0x3808 + lVar9);
    uVar2 = *(undefined8 *)((long)&(this->twiddles)._M_elems[0]._M_value + lVar8);
    uVar4 = *(undefined8 *)((long)out.storage_.data_ + 8 + lVar9);
    uVar5 = *(undefined8 *)((long)out.storage_.data_ + 0x808 + lVar9);
    fVar24 = (float)uVar4;
    fVar25 = (float)((ulong)uVar4 >> 0x20);
    fVar27 = (float)uVar5;
    fVar16 = fVar24 + fVar27;
    fVar18 = (float)((ulong)uVar5 >> 0x20);
    fVar17 = fVar25 + fVar18;
    fVar24 = fVar24 - fVar27;
    fVar25 = fVar25 - fVar18;
    *(ulong *)((long)out.storage_.data_ + 8 + lVar9) = CONCAT44(fVar17,fVar16);
    *(ulong *)((long)out.storage_.data_ + 0x808 + lVar9) = CONCAT44(fVar25,fVar24);
    fVar18 = fVar10 + fVar14;
    fVar19 = fVar11 + fVar15;
    fVar10 = fVar10 - fVar14;
    fVar11 = fVar11 - fVar15;
    *(ulong *)((long)out.storage_.data_ + 0x1008 + lVar9) = CONCAT44(fVar19,fVar18);
    fVar14 = fVar12 + fVar22;
    fVar15 = fVar13 + fVar23;
    fVar12 = fVar12 - fVar22;
    fVar13 = fVar13 - fVar23;
    *(ulong *)((long)out.storage_.data_ + 0x2008 + lVar9) = CONCAT44(fVar15,fVar14);
    *(ulong *)((long)out.storage_.data_ + 0x2808 + lVar9) = CONCAT44(fVar13,fVar12);
    fVar22 = (float)((ulong)uVar1 >> 0x20);
    fVar27 = (float)uVar1;
    fVar23 = (float)uVar2;
    fVar28 = (float)((ulong)uVar2 >> 0x20);
    fVar26 = fVar27 * fVar23 + fVar28 * -fVar22;
    fVar27 = fVar27 * fVar28 + fVar23 * fVar22;
    fVar22 = fVar20 + fVar26;
    fVar23 = fVar21 + fVar27;
    fVar20 = fVar20 - fVar26;
    fVar21 = fVar21 - fVar27;
    *(ulong *)((long)out.storage_.data_ + 0x3008 + lVar9) = CONCAT44(fVar23,fVar22);
    *(ulong *)((long)out.storage_.data_ + 0x3808 + lVar9) = CONCAT44(fVar21,fVar20);
    *(ulong *)((long)out.storage_.data_ + 0x1808 + lVar9) = CONCAT44(fVar10,fVar11) ^ 0x80000000;
    _Var3 = (this->twiddles)._M_elems[0x100]._M_value;
    fVar26 = (float)_Var3;
    fVar28 = (float)(_Var3 >> 0x20);
    fVar27 = fVar12 * fVar26 + fVar28 * -fVar13;
    fVar12 = fVar12 * fVar28 + fVar26 * fVar13;
    *(ulong *)((long)out.storage_.data_ + 0x2808 + lVar9) = CONCAT44(fVar12,fVar27);
    _Var3 = (this->twiddles)._M_elems[0x100]._M_value;
    fVar13 = (float)_Var3;
    fVar28 = (float)(_Var3 >> 0x20);
    fVar26 = fVar20 * fVar13 - fVar28 * fVar21;
    fVar20 = fVar28 * fVar20 + fVar21 * fVar13;
    fVar13 = fVar27 - fVar20;
    fVar20 = fVar20 + fVar27;
    fVar27 = fVar12 + fVar26;
    fVar12 = fVar12 - fVar26;
    *(ulong *)((long)out.storage_.data_ + 8 + lVar9) =
         CONCAT44(fVar17 + fVar19 + fVar15 + fVar23,fVar16 + fVar18 + fVar14 + fVar22);
    *(ulong *)((long)out.storage_.data_ + 0x2008 + lVar9) =
         CONCAT44((fVar17 + fVar19) - (fVar15 + fVar23),(fVar16 + fVar18) - (fVar14 + fVar22));
    *(ulong *)((long)out.storage_.data_ + 0x808 + lVar9) =
         CONCAT44(fVar25 + fVar10 + fVar27,(fVar24 - fVar11) + fVar13);
    *(ulong *)((long)out.storage_.data_ + 0x2808 + lVar9) =
         CONCAT44((fVar25 + fVar10) - fVar27,(fVar24 - fVar11) - fVar13);
    *(ulong *)((long)out.storage_.data_ + 0x1008 + lVar9) =
         CONCAT44((fVar14 - fVar22) + (fVar17 - fVar19),(fVar16 - fVar18) - (fVar15 - fVar23));
    *(ulong *)((long)out.storage_.data_ + 0x3008 + lVar9) =
         CONCAT44((fVar17 - fVar19) - (fVar14 - fVar22),(fVar15 - fVar23) + (fVar16 - fVar18));
    *(ulong *)((long)out.storage_.data_ + 0x1808 + lVar9) =
         CONCAT44((fVar25 - fVar10) + fVar20,(fVar11 + fVar24) - fVar12);
    *(ulong *)((long)out.storage_.data_ + 0x3808 + lVar9) =
         CONCAT44((fVar25 - fVar10) - fVar20,fVar12 + fVar11 + fVar24);
    lVar6 = lVar6 + 6;
    lVar7 = lVar7 + 5;
    lVar8 = lVar8 + 0x38;
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x7f8);
  return;
}

Assistant:

inline void
    butterfly_radix8(gsl::span <cpx_t, N_out> out) const noexcept
    {
        constexpr auto m = remainder(N_out);
        constexpr auto s = stride(N_out);

        for (auto i = 1; i < m; ++i) {
            if (i > 0) {
                out[i + 1*m] = multiply_fast(out[i + 1*m], twiddles[4*i*s]);
                out[i + 2*m] = multiply_fast(out[i + 2*m], twiddles[2*i*s]);
                out[i + 3*m] = multiply_fast(out[i + 3*m], twiddles[6*i*s]);
                out[i + 4*m] = multiply_fast(out[i + 4*m], twiddles[1*i*s]);
                out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[5*i*s]);
                out[i + 6*m] = multiply_fast(out[i + 6*m], twiddles[3*i*s]);
                out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[7*i*s]);
            }

            scissors(out[i + 0*m], out[i + 1*m]);
            scissors(out[i + 2*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 5*m]);
            scissors(out[i + 6*m], out[i + 7*m]);

            out[i + 3*m] = flip<Direction>(out[i + 3*m]);
            out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[m]);
            out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 2*m]);
            scissors(out[i + 1*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 6*m]);
            scissors(out[i + 5*m], out[i + 7*m]);

            out[i + 6*m] = flip<Direction>(out[i + 6*m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 4*m]);
            scissors(out[i + 1*m], out[i + 5*m]);
            scissors(out[i + 2*m], out[i + 6*m]);
            scissors(out[i + 3*m], out[i + 7*m]);
        }
    }